

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# config_parser.cc
# Opt level: O3

void __thiscall xsettingsd::ConfigParser::CharStream::UngetChar(CharStream *this,int ch)

{
  if (this->prev_at_line_end_ == true) {
    this->line_num_ = this->line_num_ + -1;
  }
  this->at_line_end_ = this->prev_at_line_end_;
  if (this->initialized_ != false) {
    if (this->have_buffered_char_ != true) {
      this->buffered_char_ = ch;
      this->have_buffered_char_ = true;
      return;
    }
    __assert_fail("!have_buffered_char_",
                  "/workspace/llm4binary/github/license_c_cmakelists/derat[P]xsettingsd/config_parser.cc"
                  ,0xaa,"void xsettingsd::ConfigParser::CharStream::UngetChar(int)");
  }
  __assert_fail("initialized_",
                "/workspace/llm4binary/github/license_c_cmakelists/derat[P]xsettingsd/config_parser.cc"
                ,0xa9,"void xsettingsd::ConfigParser::CharStream::UngetChar(int)");
}

Assistant:

void ConfigParser::CharStream::UngetChar(int ch) {
  if (prev_at_line_end_)
    line_num_--;
  at_line_end_ = prev_at_line_end_;

  assert(initialized_);
  assert(!have_buffered_char_);
  buffered_char_ = ch;
  have_buffered_char_ = true;
}